

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

BytesToSend * __thiscall
V1Transport::GetBytesToSend_abi_cxx11_(V1Transport *this,bool have_next_message)

{
  long lVar1;
  bool bVar2;
  Span<const_unsigned_char> *__elements;
  byte in_DL;
  char *in_RSI;
  Span<const_unsigned_char> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock40;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  Span<const_unsigned_char> *this_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  char *pszName;
  Span<const_unsigned_char> *mutexIn;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pszName = in_RSI;
  mutexIn = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_RDI,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(Mutex *)0xffb127);
  __elements = (Span<const_unsigned_char> *)
               MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,(AnnotatedMixin<std::mutex> *)mutexIn,pszName,
             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  if ((in_RSI[0x1a8] & 1U) == 0) {
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__elements,
               (type)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    Span<const_unsigned_char>::subspan(this_00,(size_t)__elements);
    std::
    tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::
    tuple<Span<const_unsigned_char>,_bool_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true,_true>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)this_00,__elements,
               (bool *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffb27f);
  }
  else {
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__elements,
               (type)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    Span<const_unsigned_char>::subspan(this_00,(size_t)__elements);
    in_stack_ffffffffffffff5c = CONCAT13(1,(int3)in_stack_ffffffffffffff5c);
    if ((in_DL & 1) == 0) {
      bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
      in_stack_ffffffffffffff5c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff5c) ^ 0xff000000;
    }
    std::
    tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::
    tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true,_true>
              ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)this_00,__elements,
               (bool *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffb212);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (BytesToSend *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Transport::BytesToSend V1Transport::GetBytesToSend(bool have_next_message) const noexcept
{
    AssertLockNotHeld(m_send_mutex);
    LOCK(m_send_mutex);
    if (m_sending_header) {
        return {Span{m_header_to_send}.subspan(m_bytes_sent),
                // We have more to send after the header if the message has payload, or if there
                // is a next message after that.
                have_next_message || !m_message_to_send.data.empty(),
                m_message_to_send.m_type
               };
    } else {
        return {Span{m_message_to_send.data}.subspan(m_bytes_sent),
                // We only have more to send after this message's payload if there is another
                // message.
                have_next_message,
                m_message_to_send.m_type
               };
    }
}